

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pstd.h
# Opt level: O2

void __thiscall
pstd::pmr::polymorphic_allocator<std::byte>::
construct<pbrt::FloatImageTexture,pbrt::TextureMapping2DHandle&,std::__cxx11::string&,std::__cxx11::string&,float&,pbrt::WrapMode&,float&,pbrt::ColorEncodingHandle&,pstd::pmr::polymorphic_allocator<std::byte>&>
          (polymorphic_allocator<std::byte> *this,FloatImageTexture *p,TextureMapping2DHandle *args,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args_1,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args_2,float *args_3,
          WrapMode *args_4,float *args_5,ColorEncodingHandle *args_6,
          polymorphic_allocator<std::byte> *args_7)

{
  TaggedPointer<pbrt::LinearColorEncoding,_pbrt::sRGBColorEncoding,_pbrt::GammaColorEncoding>
  local_18;
  TaggedPointer<pbrt::UVMapping2D,_pbrt::SphericalMapping2D,_pbrt::CylindricalMapping2D,_pbrt::PlanarMapping2D>
  local_10;
  
  local_10.bits =
       (args->
       super_TaggedPointer<pbrt::UVMapping2D,_pbrt::SphericalMapping2D,_pbrt::CylindricalMapping2D,_pbrt::PlanarMapping2D>
       ).bits;
  local_18.bits =
       (args_6->
       super_TaggedPointer<pbrt::LinearColorEncoding,_pbrt::sRGBColorEncoding,_pbrt::GammaColorEncoding>
       ).bits;
  pbrt::FloatImageTexture::FloatImageTexture
            (p,(TextureMapping2DHandle *)&local_10,args_1,args_2,*args_3,*args_4,*args_5,
             (ColorEncodingHandle *)&local_18,args_7->memoryResource);
  return;
}

Assistant:

void construct(T *p, Args &&... args) {
        ::new ((void *)p) T(std::forward<Args>(args)...);
    }